

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSetLayout.cpp
# Opt level: O1

Ptr<DescriptorSetLayout> __thiscall
myvk::DescriptorSetLayout::Create
          (DescriptorSetLayout *this,Ptr<Device> *device,
          vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
          *bindings)

{
  element_type *peVar1;
  VkResult VVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Ptr<DescriptorSetLayout> PVar4;
  shared_ptr<myvk::DescriptorSetLayout> ret;
  VkDescriptorSetLayoutCreateInfo info;
  _func_int **local_58;
  element_type *peStack_50;
  VkDescriptorSetLayoutCreateInfo local_48;
  
  std::__shared_ptr<myvk::DescriptorSetLayout,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::DescriptorSetLayout>>
            ((__shared_ptr<myvk::DescriptorSetLayout,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (allocator<myvk::DescriptorSetLayout> *)&local_48);
  local_58[3] = (_func_int *)
                (device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 4),
             &(device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_48.pNext = (void *)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  local_48._4_4_ = 0;
  local_48.pBindings =
       (bindings->
       super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_48._16_8_ =
       (ulong)(uint)((int)((ulong)((long)(bindings->
                                         super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48.pBindings) >> 3) * -0x55555555) << 0x20;
  VVar2 = (*vkCreateDescriptorSetLayout)
                    (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                     ->m_device,&local_48,(VkAllocationCallbacks *)0x0,
                     (VkDescriptorSetLayout *)(local_58 + 5));
  peVar1 = peStack_50;
  if (VVar2 == VK_SUCCESS) {
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    peStack_50 = (element_type *)0x0;
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_58;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    local_58 = (_func_int **)0x0;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  _Var3._M_pi = extraout_RDX;
  if (peStack_50 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_50);
    _Var3._M_pi = extraout_RDX_00;
  }
  PVar4.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  PVar4.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<DescriptorSetLayout>)
         PVar4.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<DescriptorSetLayout> DescriptorSetLayout::Create(const Ptr<Device> &device,
                                                     const std::vector<VkDescriptorSetLayoutBinding> &bindings) {
	auto ret = std::make_shared<DescriptorSetLayout>();
	ret->m_device_ptr = device;

	VkDescriptorSetLayoutCreateInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
	info.bindingCount = bindings.size();
	info.pBindings = bindings.data();

	if (vkCreateDescriptorSetLayout(device->GetHandle(), &info, nullptr, &ret->m_descriptor_set_layout) != VK_SUCCESS)
		return nullptr;

	return ret;
}